

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ekf.hpp
# Opt level: O2

void __thiscall EKF::observe(EKF *this,Vector3f *obs_p,Quaternionf *obs_q)

{
  Vector3f *this_00;
  Quaternionf *_a;
  MatrixXf *this_01;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  VectorXf dx;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>_>
  local_188;
  MatrixXf QR;
  undefined1 local_120 [56];
  MatrixXf R;
  MatrixXf H;
  VectorXf error;
  Quaternionf dq;
  MatrixXf Sui;
  MatrixXf Q;
  MatrixXf Su;
  MatrixXf Kt;
  
  toVec((EKF *)local_120,&this->gravity,(Quaternionf *)obs_p);
  this_00 = &this->pos;
  _a = &this->qua;
  toVec((EKF *)&H,&this->gravity,(Quaternionf *)this_00);
  Eigen::MatrixBase<Eigen::Matrix<float,-1,1,0,-1,1>>::operator-
            ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>
              *)&local_188,(MatrixBase<Eigen::Matrix<float,_1,1,0,_1,1>> *)local_120,
             (MatrixBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)&H);
  Eigen::PlainObjectBase<Eigen::Matrix<float,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,float>,Eigen::Matrix<float,_1,1,0,_1,1>const,Eigen::Matrix<float,_1,1,0,_1,1>const>>
            ((PlainObjectBase<Eigen::Matrix<float,_1,1,0,_1,1>> *)&error,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
              *)&local_188);
  free(H.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free((void *)local_120._0_8_);
  calcH(&H,this,_a);
  local_188.m_lhs._0_4_ = 0x10;
  local_120._0_4_ = 0x10;
  Eigen::Matrix<float,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<float,_1,_1,0,_1,_1> *)&QR,(int *)&local_188,(int *)local_120);
  Eigen::DenseBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::setZero
            ((DenseBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)&QR);
  Eigen::DenseBase<Eigen::Matrix<float,-1,-1,0,-1,-1>>::topLeftCorner<int,int>
            ((Type *)&local_188,&QR,7,7);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>,_1,_1,false>,Eigen::Matrix<float,_1,_1,0,_1,_1>>
            ((Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false> *)&local_188,&this->Wu);
  this_01 = &this->Pu;
  Q.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_data = (float *)&H;
  local_120._0_16_ =
       (undefined1  [16])
       Eigen::MatrixBase<Eigen::Matrix<float,-1,-1,0,-1,-1>>::operator*
                 ((MatrixBase<Eigen::Matrix<float,_1,_1,0,_1,_1>> *)this_01,
                  (MatrixBase<Eigen::Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_> *)&Q);
  Eigen::DenseBase<Eigen::Matrix<float,-1,-1,0,-1,-1>>::bottomLeftCorner<int,int>
            ((Type *)&local_188,&QR,9,7);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>,_1,_1,false>,Eigen::Product<Eigen::Matrix<float,_1,_1,0,_1,_1>,Eigen::Transpose<Eigen::Matrix<float,_1,_1,0,_1,_1>>,0>>
            ((Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false> *)&local_188,
             (Product<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_0>
              *)local_120);
  Eigen::DenseBase<Eigen::Matrix<float,-1,-1,0,-1,-1>>::bottomRightCorner<int,int>
            ((Type *)&local_188,&QR,9,9);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>,_1,_1,false>,Eigen::Matrix<float,_1,_1,0,_1,_1>>
            ((Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false> *)&local_188,this_01);
  Eigen::HouseholderQR<Eigen::Matrix<float,-1,-1,0,-1,-1>>::
  HouseholderQR<Eigen::Matrix<float,_1,_1,0,_1,_1>>
            ((HouseholderQR<Eigen::Matrix<float,_1,_1,0,_1,_1>> *)&local_188,
             (EigenBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)&QR);
  Eigen::HouseholderQR<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::householderQ
            ((HouseholderSequenceType *)local_120,
             (HouseholderQR<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)&local_188);
  Eigen::PlainObjectBase<Eigen::Matrix<float,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::HouseholderSequence<Eigen::Matrix<float,_1,_1,0,_1,_1>,Eigen::Matrix<float,_1,1,0,_1,1>,1>>
            ((PlainObjectBase<Eigen::Matrix<float,_1,_1,0,_1,_1>> *)&Q,
             (EigenBase<Eigen::HouseholderSequence<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_1>_>
              *)local_120);
  Eigen::HouseholderQR<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::~HouseholderQR
            ((HouseholderQR<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)&local_188);
  local_120._0_8_ = (PlainObjectBase<Eigen::Matrix<float,_1,_1,0,_1,_1>> *)&Q;
  local_188._0_16_ =
       Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<float,-1,-1,0,-1,-1>>>::operator*
                 ((MatrixBase<Eigen::Transpose<Eigen::Matrix<float,_1,_1,0,_1,_1>>> *)local_120,
                  (MatrixBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)&QR);
  Eigen::PlainObjectBase<Eigen::Matrix<float,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<float,_1,_1,0,_1,_1>>,Eigen::Matrix<float,_1,_1,0,_1,_1>,0>>
            ((PlainObjectBase<Eigen::Matrix<float,_1,_1,0,_1,_1>> *)&R,
             (DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0>_>
              *)&local_188);
  Eigen::DenseBase<Eigen::Matrix<float,-1,-1,0,-1,-1>>::topRightCorner<int,int>
            ((Type *)&local_188,&R,7,9);
  Eigen::PlainObjectBase<Eigen::Matrix<float,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>,_1,_1,false>>
            ((PlainObjectBase<Eigen::Matrix<float,_1,_1,0,_1,_1>> *)&Kt,
             (DenseBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>_> *)
             &local_188);
  Eigen::DenseBase<Eigen::Matrix<float,-1,-1,0,-1,-1>>::topLeftCorner<int,int>
            ((Type *)&local_188,&R,7,7);
  Eigen::PlainObjectBase<Eigen::Matrix<float,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>,_1,_1,false>>
            ((PlainObjectBase<Eigen::Matrix<float,_1,_1,0,_1,_1>> *)&Su,
             (DenseBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>_> *)
             &local_188);
  dx.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_data = (float *)&Su;
  Eigen::MatrixBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::Identity
            ((IdentityReturnType *)&local_188,7,7);
  local_120._8_8_ = (non_const_type)&local_188;
  local_120._0_8_ = (non_const_type)&dx;
  Eigen::PlainObjectBase<Eigen::Matrix<float,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::Solve<Eigen::TriangularView<Eigen::Matrix<float,_1,_1,0,_1,_1>,2u>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,Eigen::Matrix<float,_1,_1,0,_1,_1>>>>
            ((PlainObjectBase<Eigen::Matrix<float,_1,_1,0,_1,_1>> *)&Sui,
             (DenseBase<Eigen::Solve<Eigen::TriangularView<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_2U>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>_>
              *)local_120);
  Eigen::DenseBase<Eigen::Matrix<float,-1,-1,0,-1,-1>>::bottomRightCorner<int,int>
            ((Type *)&local_188,&R,9,9);
  Eigen::internal::
  call_assignment<Eigen::Matrix<float,_1,_1,0,_1,_1>,Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>,_1,_1,false>>
            (this_01,(Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false> *)&local_188);
  dq.m_coeffs.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array.
  _0_8_ = (PlainObjectBase<Eigen::Matrix<float,_1,_1,0,_1,_1>> *)&Kt;
  local_120._0_16_ =
       (undefined1  [16])
       Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<float,-1,-1,0,-1,-1>>>::operator*
                 ((MatrixBase<Eigen::Transpose<Eigen::Matrix<float,_1,_1,0,_1,_1>>> *)&dq,
                  (MatrixBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)&Sui);
  Eigen::
  Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>,_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0>,_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0>
  ::Product((Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0>
             *)&local_188,(Lhs *)local_120,&error);
  Eigen::PlainObjectBase<Eigen::Matrix<float,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<float,_1,_1,0,_1,_1>>,Eigen::Matrix<float,_1,_1,0,_1,_1>,0>,Eigen::Matrix<float,_1,1,0,_1,1>,0>>
            ((PlainObjectBase<Eigen::Matrix<float,_1,1,0,_1,1>> *)&dx,
             (DenseBase<Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0>_>
              *)&local_188);
  Eigen::DenseBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::bottomRows<int>
            ((Type *)&local_188,(DenseBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)&dx,3);
  Eigen::PlainObjectBase<Eigen::Matrix<float,3,1,0,3,1>>::
  PlainObjectBase<Eigen::Block<Eigen::Matrix<float,_1,1,0,_1,1>,_1,1,false>>
            ((PlainObjectBase<Eigen::Matrix<float,3,1,0,3,1>> *)local_120,
             (DenseBase<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
             &local_188);
  exp((EKF *)&dq,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
  Eigen::DenseBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::topRows<int>
            ((Type *)local_120,(DenseBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)&dx,3);
  Eigen::MatrixBase<Eigen::Matrix<float,3,1,0,3,1>>::operator+
            ((CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>_>
              *)&local_188,(MatrixBase<Eigen::Matrix<float,3,1,0,3,1>> *)this_00,
             (MatrixBase<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
             local_120);
  Eigen::internal::
  call_assignment<Eigen::Matrix<float,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,float>,Eigen::Matrix<float,3,1,0,3,1>const,Eigen::Block<Eigen::Matrix<float,_1,1,0,_1,1>,_1,1,false>const>>
            (this_00,(CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                      *)&local_188);
  Eigen::Block<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_-1,_-1,_false>::Block
            ((Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false> *)local_120,&dx,3,0,3,1);
  Eigen::MatrixBase<Eigen::Matrix<float,3,1,0,3,1>>::operator+
            (&local_188,(MatrixBase<Eigen::Matrix<float,3,1,0,3,1>> *)&this->vel,
             (MatrixBase<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>_> *)
             local_120);
  Eigen::internal::
  call_assignment<Eigen::Matrix<float,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,float>,Eigen::Matrix<float,3,1,0,3,1>const,Eigen::Block<Eigen::Matrix<float,_1,1,0,_1,1>,_1,_1,false>const>>
            (&this->vel,&local_188);
  Eigen::internal::quat_product<1,_Eigen::Quaternion<float,_0>,_Eigen::Quaternion<float,_0>,_float>
  ::run((QuaternionBase<Eigen::Quaternion<float,_0>_> *)_a,
        (QuaternionBase<Eigen::Quaternion<float,_0>_> *)&dq);
  *(LhsNested *)
   (_a->m_coeffs).super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
       = local_188.m_lhs;
  *(PointerType *)
   ((this->qua).m_coeffs.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
    m_data.array + 2) =
       local_188.m_rhs.
       super_BlockImpl<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false,_true>.
       super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,_0>.m_data;
  free(dx.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  free(Sui.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(Su.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(Kt.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(R.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(Q.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(QR.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(H.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(error.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  return;
}

Assistant:

void observe(const Eigen::Vector3f& obs_p, const Eigen::Quaternionf& obs_q)
  {
    // inovation residual vector (7x1)
    Eigen::VectorXf error = toVec(obs_p, obs_q) - toVec(pos, qua);

    // observation jacobian (7x9)
    Eigen::MatrixXf H = calcH(qua);

    // QR decompose
    Eigen::MatrixXf QR(16, 16);
    QR.setZero();
    QR.topLeftCorner(7, 7) = Wu;
    QR.bottomLeftCorner(9, 7) = Pu * H.transpose();  // (9x7)=(9x9)*(9x7)
    QR.bottomRightCorner(9, 9) = Pu;
    Eigen::MatrixXf Q = QR.householderQr().householderQ();  // (16x16)
    Eigen::MatrixXf R = Q.transpose() * QR;                 // (16x16)

    Eigen::MatrixXf Kt = R.topRightCorner(7, 9);             // (7x9) upper trianguler matrix of the modified Kalman gain
    Eigen::MatrixXf Su = R.topLeftCorner(7, 7);              // (7x7) upper trianguler matrix of the inovation matrix
    Eigen::MatrixXf Sui = Su.triangularView<Eigen::Upper>()  // (7x7) inverse of the upper trianguler of the inovation matrix
                              .solve(Eigen::MatrixXf::Identity(7, 7));

    // update variance covariance matrix
    Pu = R.bottomRightCorner(9, 9);

    Eigen::VectorXf dx = (Kt.transpose() * Sui) * error;  // (9x1)=(9x7)*(7x7)*(7x1)

    // updata state vector
    Eigen::Quaternionf dq = exp(dx.bottomRows(3));
    pos = pos + dx.topRows(3);
    vel = vel + dx.block(3, 0, 3, 1);
    qua = qua * dq;
  }